

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986Fragment(xmlURIPtr uri,char **str)

{
  xmlChar *pxVar1;
  char *pcVar2;
  bool bVar3;
  char *local_28;
  char *cur;
  char **str_local;
  xmlURIPtr uri_local;
  
  if (str == (char **)0x0) {
    uri_local._4_4_ = -1;
  }
  else {
    local_28 = *str;
    while( true ) {
      if (((((((*local_28 < 'a') || (bVar3 = true, 'z' < *local_28)) &&
             ((*local_28 < 'A' || (bVar3 = true, 'Z' < *local_28)))) &&
            ((((*local_28 < '0' || (bVar3 = true, '9' < *local_28)) &&
              (bVar3 = true, *local_28 != '-')) &&
             ((bVar3 = true, *local_28 != '.' && (bVar3 = true, *local_28 != '_')))))) &&
           (bVar3 = true, *local_28 != '~')) &&
          (((*local_28 != '%' ||
            ((((local_28[1] < '0' || ('9' < local_28[1])) &&
              ((local_28[1] < 'a' || ('f' < local_28[1])))) &&
             ((local_28[1] < 'A' || ('F' < local_28[1])))))) ||
           (((local_28[2] < '0' || (bVar3 = true, '9' < local_28[2])) &&
            (((local_28[2] < 'a' || (bVar3 = true, 'f' < local_28[2])) &&
             ((local_28[2] < 'A' || (bVar3 = true, 'F' < local_28[2])))))))))) &&
         (((((bVar3 = true, *local_28 != '!' && (bVar3 = true, *local_28 != '$')) &&
            (bVar3 = true, *local_28 != '&')) &&
           ((bVar3 = true, *local_28 != '(' && (bVar3 = true, *local_28 != ')')))) &&
          ((bVar3 = true, *local_28 != '*' &&
           ((((bVar3 = true, *local_28 != '+' && (bVar3 = true, *local_28 != ',')) &&
             ((bVar3 = true, *local_28 != ';' &&
              (((bVar3 = true, *local_28 != '=' && (bVar3 = true, *local_28 != '\'')) &&
               (bVar3 = true, *local_28 != ':')))))) &&
            (((bVar3 = true, *local_28 != '@' && (bVar3 = true, *local_28 != '/')) &&
             ((bVar3 = true, *local_28 != '?' &&
              (((((bVar3 = true, *local_28 != '[' && (bVar3 = true, *local_28 != ']')) &&
                 ((bVar3 = false, uri != (xmlURIPtr)0x0 &&
                  ((((bVar3 = false, (uri->cleanup & 1U) != 0 && (bVar3 = true, *local_28 != '{'))
                    && (bVar3 = true, *local_28 != '}')) &&
                   ((bVar3 = true, *local_28 != '|' && (bVar3 = true, *local_28 != '\\')))))))) &&
                (bVar3 = true, *local_28 != '^')) &&
               ((bVar3 = true, *local_28 != '[' && (bVar3 = true, *local_28 != ']')))))))))))))))) {
        bVar3 = *local_28 == '`';
      }
      if (!bVar3) break;
      if (*local_28 == '%') {
        local_28 = local_28 + 3;
      }
      else {
        local_28 = local_28 + 1;
      }
    }
    if (uri != (xmlURIPtr)0x0) {
      if (uri->fragment != (char *)0x0) {
        (*xmlFree)(uri->fragment);
      }
      if ((uri->cleanup & 2U) == 0) {
        pcVar2 = xmlURIUnescapeString(*str,(int)local_28 - (int)*str,(char *)0x0);
        uri->fragment = pcVar2;
      }
      else {
        pxVar1 = xmlStrndup((xmlChar *)*str,(int)local_28 - (int)*str);
        uri->fragment = (char *)pxVar1;
      }
    }
    *str = local_28;
    uri_local._4_4_ = 0;
  }
  return uri_local._4_4_;
}

Assistant:

static int
xmlParse3986Fragment(xmlURIPtr uri, const char **str)
{
    const char *cur;

    if (str == NULL)
        return (-1);

    cur = *str;

    while ((ISA_PCHAR(cur)) || (*cur == '/') || (*cur == '?') ||
           (*cur == '[') || (*cur == ']') ||
           ((uri != NULL) && (uri->cleanup & 1) && (IS_UNWISE(cur))))
        NEXT(cur);
    if (uri != NULL) {
        if (uri->fragment != NULL)
            xmlFree(uri->fragment);
	if (uri->cleanup & 2)
	    uri->fragment = STRNDUP(*str, cur - *str);
	else
	    uri->fragment = xmlURIUnescapeString(*str, cur - *str, NULL);
    }
    *str = cur;
    return (0);
}